

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_json_mapping_api.cpp
# Opt level: O0

JsonMappingApi * __thiscall
cfd::js::api::json::JsonMappingApi::CreatePegInAddress(JsonMappingApi *this,string *request_message)

{
  function<cfd::js::api::CreatePegInAddressResponseStruct_(const_cfd::js::api::CreatePegInAddressRequestStruct_&)>
  local_38;
  string *local_18;
  string *request_message_local;
  
  local_18 = request_message;
  request_message_local = (string *)this;
  std::
  function<cfd::js::api::CreatePegInAddressResponseStruct(cfd::js::api::CreatePegInAddressRequestStruct_const&)>
  ::
  function<cfd::js::api::CreatePegInAddressResponseStruct(&)(cfd::js::api::CreatePegInAddressRequestStruct_const&),void>
            ((function<cfd::js::api::CreatePegInAddressResponseStruct(cfd::js::api::CreatePegInAddressRequestStruct_const&)>
              *)&local_38,ElementsAddressStructApi::CreatePegInAddress);
  ExecuteJsonApi<cfd::js::api::json::CreatePegInAddressRequest,cfd::js::api::json::CreatePegInAddressResponse,cfd::js::api::CreatePegInAddressRequestStruct,cfd::js::api::CreatePegInAddressResponseStruct>
            ((json *)this,request_message,&local_38);
  std::
  function<cfd::js::api::CreatePegInAddressResponseStruct_(const_cfd::js::api::CreatePegInAddressRequestStruct_&)>
  ::~function(&local_38);
  return this;
}

Assistant:

std::string JsonMappingApi::CreatePegInAddress(
    const std::string &request_message) {
  return ExecuteJsonApi<
      api::json::CreatePegInAddressRequest,
      api::json::CreatePegInAddressResponse,
      api::CreatePegInAddressRequestStruct,
      api::CreatePegInAddressResponseStruct>(
      request_message, ElementsAddressStructApi::CreatePegInAddress);
}